

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

void * lj_alloc_create(PRNGState *rs)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  void *__s;
  
  pvVar2 = mmap_probe(rs,0x20000);
  if (pvVar2 == (void *)0xffffffffffffffff) {
    __s = (void *)0x0;
  }
  else {
    uVar5 = (ulong)(-(int)pvVar2 - 0x10U & 7);
    lVar1 = (long)pvVar2 + uVar5;
    __s = (void *)((long)pvVar2 + uVar5 + 0x10);
    memset(__s,0,0x370);
    *(undefined8 *)((long)pvVar2 + uVar5 + 8) = 0x373;
    *(void **)((long)pvVar2 + uVar5 + 0x358) = pvVar2;
    *(undefined8 *)((long)pvVar2 + uVar5 + 0x360) = 0x20000;
    *(undefined8 *)((long)pvVar2 + uVar5 + 0x40) = 0xff;
    lVar3 = (long)pvVar2 + uVar5 + 0x48;
    lVar4 = 0x20;
    do {
      *(long *)(lVar3 + 0x18) = lVar3;
      *(long *)(lVar3 + 0x10) = lVar3;
      lVar3 = lVar3 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    uVar5 = (ulong)(-(int)lVar1 - 0x380U & 7);
    lVar3 = lVar1 + uVar5;
    uVar5 = (long)pvVar2 + (-uVar5 - (lVar1 + 0x370)) + 0x1ffc0;
    *(long *)(lVar1 + 0x30) = lVar3 + 0x370;
    *(ulong *)(lVar1 + 0x20) = uVar5;
    *(ulong *)(lVar3 + 0x378) = uVar5 | 1;
    *(undefined8 *)((long)pvVar2 + 0x1ffc8) = 0x40;
    *(undefined8 *)(lVar1 + 0x38) = 0x200000;
  }
  return __s;
}

Assistant:

void *lj_alloc_create(PRNGState *rs)
{
  size_t tsize = DEFAULT_GRANULARITY;
  char *tbase;
  INIT_MMAP();
  UNUSED(rs);
  tbase = (char *)(CALL_MMAP(rs, tsize));
  if (tbase != CMFAIL) {
    size_t msize = pad_request(sizeof(struct malloc_state));
    mchunkptr mn;
    mchunkptr msp = align_as_chunk(tbase);
    mstate m = (mstate)(chunk2mem(msp));
    memset(m, 0, msize);
    msp->head = (msize|PINUSE_BIT|CINUSE_BIT);
    m->seg.base = tbase;
    m->seg.size = tsize;
    m->release_checks = MAX_RELEASE_CHECK_RATE;
    init_bins(m);
    mn = next_chunk(mem2chunk(m));
    init_top(m, mn, (size_t)((tbase + tsize) - (char *)mn) - TOP_FOOT_SIZE);
    return m;
  }
  return NULL;
}